

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O1

void mock(StatsdServer *server,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *messages)

{
  pointer *ppbVar1;
  pointer pbVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  string recvd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ppbVar1 = &(messages->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    Statsd::StatsdServer::receive_abi_cxx11_(&local_50,server);
    do {
      lVar4 = std::__cxx11::string::find((char)&local_50,10);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)messages,
                 &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      lVar5 = std::__cxx11::string::find
                        ((char *)((messages->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + -1),0x10a060,0);
      if (lVar5 != -1) {
        pbVar2 = *ppbVar1;
        *ppbVar1 = pbVar2 + -1;
        pcVar3 = pbVar2[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &pbVar2[-1].field_2) {
          operator_delete(pcVar3);
        }
        break;
      }
    } while (lVar4 != -1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (((lVar5 != -1) || ((server->m_errorMessage)._M_string_length != 0)) ||
       ((*ppbVar1)[-1]._M_string_length == 0)) {
      return;
    }
  } while( true );
}

Assistant:

void mock(StatsdServer& server, std::vector<std::string>& messages) {
    do {
        // Grab the messages that are waiting
        auto recvd = server.receive();

        // Split the messages on '\n'
        auto start = std::string::npos;
        do {
            // Keep this message
            auto end = recvd.find('\n', ++start);
            messages.emplace_back(recvd.substr(start, end));
            start = end;

            // Bail if we found the special quit message
            if (messages.back().find("DONE") != std::string::npos) {
                messages.pop_back();
                return;
            }
        } while (start != std::string::npos);
    } while (server.errorMessage().empty() && !messages.back().empty());
}